

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O0

const_iterator __thiscall toml::detail::region::line_end(region *this)

{
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> _Var1;
  char local_29;
  char *local_28;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_20;
  region *local_18;
  region *this_local;
  
  local_18 = this;
  local_20._M_current = (char *)last(this);
  local_28 = (char *)end(this);
  local_29 = '\n';
  _Var1 = std::
          find<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,char>
                    (local_20,(__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                               )local_28,&local_29);
  return (const_iterator)_Var1._M_current;
}

Assistant:

const_iterator line_end() const noexcept
    {
        return std::find(this->last(), this->end(), '\n');
    }